

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::setLinePointsindiced
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  GLuint GVar1;
  AdjacencyGrid *pAVar2;
  AdjacencyGridLineSegment *pAVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  undefined4 *puVar6;
  undefined4 *puVar7;
  GLfloat *pGVar8;
  GLfloat *pGVar9;
  GLuint *pGVar10;
  GLfloat *pGVar11;
  long lVar12;
  GLfloat *pGVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  
  pAVar2 = test_data->m_grid;
  GVar1 = pAVar2->m_n_segments;
  test_data->m_n_vertices = GVar1 * 2;
  uVar16 = this->m_n_components_output * GVar1 * 8;
  test_data->m_geometry_bo_size = uVar16;
  uVar15 = pAVar2->m_n_points * this->m_n_components_input * 4;
  test_data->m_vertex_data_bo_size = uVar15;
  test_data->m_index_data_bo_size = GVar1 << 4;
  pGVar8 = (GLfloat *)operator_new__((ulong)uVar16);
  test_data->m_expected_adjacency_geometry = pGVar8;
  pGVar9 = (GLfloat *)operator_new__((ulong)uVar16);
  test_data->m_expected_geometry = pGVar9;
  pGVar10 = (GLuint *)operator_new__((ulong)(GVar1 << 4));
  test_data->m_index_data = pGVar10;
  pGVar11 = (GLfloat *)operator_new__((ulong)uVar15);
  test_data->m_vertex_data = pGVar11;
  uVar15 = pAVar2->m_n_points;
  if ((ulong)uVar15 != 0) {
    pGVar13 = &pAVar2->m_points->y;
    uVar14 = 0;
    do {
      pGVar11[uVar14 * 2] = pGVar13[-1];
      pGVar11[uVar14 * 2 + 1] = *pGVar13;
      uVar14 = uVar14 + 1;
      pGVar13 = pGVar13 + 3;
    } while (uVar15 != uVar14);
  }
  if (pAVar2->m_n_segments != 0) {
    pAVar3 = pAVar2->m_line_segments;
    lVar12 = 0;
    uVar14 = 0;
    do {
      puVar4 = *(undefined4 **)((long)&pAVar3->m_point_end_adjacent + lVar12 * 2);
      *(undefined4 *)((long)pGVar10 + lVar12) = *puVar4;
      puVar5 = *(undefined4 **)((long)&pAVar3->m_point_end + lVar12 * 2);
      *(undefined4 *)((long)pGVar10 + lVar12 + 4) = *puVar5;
      puVar6 = *(undefined4 **)((long)&pAVar3->m_point_start + lVar12 * 2);
      *(undefined4 *)((long)pGVar10 + lVar12 + 8) = *puVar6;
      puVar7 = *(undefined4 **)((long)&pAVar3->m_point_start_adjacent + lVar12 * 2);
      *(undefined4 *)((long)pGVar10 + lVar12 + 0xc) = *puVar7;
      *(undefined4 *)((long)pGVar8 + lVar12 * 2) = puVar4[1];
      *(undefined4 *)((long)pGVar8 + lVar12 * 2 + 4) = puVar4[2];
      *(undefined8 *)((long)pGVar8 + lVar12 * 2 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar8 + lVar12 * 2 + 0x10) = puVar7[1];
      *(undefined4 *)((long)pGVar8 + lVar12 * 2 + 0x14) = puVar7[2];
      *(undefined8 *)((long)pGVar8 + lVar12 * 2 + 0x18) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar9 + lVar12 * 2) = puVar5[1];
      *(undefined4 *)((long)pGVar9 + lVar12 * 2 + 4) = puVar5[2];
      *(undefined8 *)((long)pGVar9 + lVar12 * 2 + 8) = 0x3f80000000000000;
      *(undefined4 *)((long)pGVar9 + lVar12 * 2 + 0x10) = puVar6[1];
      *(undefined4 *)((long)pGVar9 + lVar12 * 2 + 0x14) = puVar6[2];
      *(undefined8 *)((long)pGVar9 + lVar12 * 2 + 0x18) = 0x3f80000000000000;
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x10;
    } while (uVar14 < pAVar2->m_n_segments);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::setLinePointsindiced(AdjacencyTestData& test_data)
{
	float*		  travellerExpectedAdjacencyGeometryPtr = 0;
	float*		  travellerExpectedGeometryPtr			= 0;
	unsigned int* travellerIndicesPtr					= 0;
	float*		  travellerPtr							= 0;

	/* Set buffer sizes */
	test_data.m_n_vertices = test_data.m_grid->m_n_segments * 2 /* start + end points form a segment */;
	test_data.m_geometry_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * m_n_components_output * sizeof(float));
	test_data.m_vertex_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_grid->m_n_points * m_n_components_input * sizeof(float));
	test_data.m_index_data_bo_size =
		static_cast<glw::GLuint>(test_data.m_n_vertices * 2 /* include adjacency info */ * sizeof(unsigned int));

	/* Allocate memory for input and expected data */
	test_data.m_expected_adjacency_geometry = new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_expected_geometry			= new float[test_data.m_geometry_bo_size / sizeof(float)];
	test_data.m_index_data					= new unsigned int[test_data.m_index_data_bo_size / sizeof(unsigned int)];
	test_data.m_vertex_data					= new float[test_data.m_vertex_data_bo_size / sizeof(float)];

	travellerExpectedAdjacencyGeometryPtr = test_data.m_expected_adjacency_geometry;
	travellerExpectedGeometryPtr		  = test_data.m_expected_geometry;
	travellerIndicesPtr					  = test_data.m_index_data;
	travellerPtr						  = test_data.m_vertex_data;

	/* Set input and expected values */
	for (unsigned int n = 0; n < test_data.m_grid->m_n_points; ++n)
	{
		*travellerPtr = test_data.m_grid->m_points[n].x;
		++travellerPtr;
		*travellerPtr = test_data.m_grid->m_points[n].y;
		++travellerPtr;
	}

	for (unsigned int n = 0; n < test_data.m_grid->m_n_segments; ++n)
	{
		AdjacencyGridLineSegment* segmentPtr = test_data.m_grid->m_line_segments + n;

		*travellerIndicesPtr = segmentPtr->m_point_end_adjacent->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_end->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_start->index;
		++travellerIndicesPtr;
		*travellerIndicesPtr = segmentPtr->m_point_start_adjacent->index;
		++travellerIndicesPtr;

		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_end_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->x;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = segmentPtr->m_point_start_adjacent->y;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 0;
		++travellerExpectedAdjacencyGeometryPtr;
		*travellerExpectedAdjacencyGeometryPtr = 1;
		++travellerExpectedAdjacencyGeometryPtr;

		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_end->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->x;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = segmentPtr->m_point_start->y;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 0;
		++travellerExpectedGeometryPtr;
		*travellerExpectedGeometryPtr = 1;
		++travellerExpectedGeometryPtr;
	} /* for (all line segments) */
}